

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O3

HT_TaskScheduler * ht_task_scheduler_create(HT_ErrorCode *out_err)

{
  HT_ErrorCode HVar1;
  HT_TaskScheduler *bag;
  
  if (realloc_fnc_ == (realloc_function)0x0) {
    bag = (HT_TaskScheduler *)malloc(0x28);
  }
  else {
    bag = (HT_TaskScheduler *)(*realloc_fnc_)((void *)0x0,0x28,user_data_);
  }
  if (bag == (HT_TaskScheduler *)0x0) {
    HVar1 = HT_ERR_OUT_OF_MEMORY;
  }
  else {
    HVar1 = ht_bag_void_ptr_init(&bag->tasks,0x10);
    if (HVar1 == HT_ERR_OK) {
      bag->next_task_id = 0;
      HVar1 = HT_ERR_OK;
      goto LAB_00107f3e;
    }
    if (realloc_fnc_ == (realloc_function)0x0) {
      free(bag);
    }
    else {
      (*realloc_fnc_)(bag,0,user_data_);
    }
  }
  bag = (HT_TaskScheduler *)0x0;
LAB_00107f3e:
  if (out_err != (HT_ErrorCode *)0x0) {
    *out_err = HVar1;
  }
  return bag;
}

Assistant:

HT_TaskScheduler*
ht_task_scheduler_create(HT_ErrorCode* out_err)
{
    HT_TaskScheduler* task_scheduler = HT_CREATE_TYPE(HT_TaskScheduler);
    HT_ErrorCode error_code;

    if (task_scheduler == NULL)
    {
        error_code = HT_ERR_OUT_OF_MEMORY;
        goto done;
    }

    error_code = ht_bag_void_ptr_init(&task_scheduler->tasks, DEFAULT_INIT_TASK_COUNT_);
    if (error_code != HT_ERR_OK)
    {
        ht_free(task_scheduler);
        task_scheduler = NULL;
        goto done;
    }

    task_scheduler->next_task_id = 0;

done:
    HT_SET_ERROR(out_err, error_code);

    return task_scheduler;
}